

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  int iVar1;
  JDIMENSION JVar2;
  int local_50;
  int ci;
  JDIMENSION num_cols;
  int num_components;
  JDIMENSION count;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY ppJStack_28;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  iVar1 = cinfo->num_components;
  JVar2 = cinfo->output_width;
  inptr._4_4_ = num_rows;
  ppJStack_28 = output_buf;
  output_buf_local._4_4_ = input_row;
  while (inptr._4_4_ = inptr._4_4_ + -1, -1 < inptr._4_4_) {
    for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
      _num_components = *ppJStack_28 + local_50;
      outptr = input_buf[local_50][output_buf_local._4_4_];
      for (num_cols = JVar2; num_cols != 0; num_cols = num_cols - 1) {
        *_num_components = *outptr;
        _num_components = _num_components + iVar1;
        outptr = outptr + 1;
      }
    }
    output_buf_local._4_4_ = output_buf_local._4_4_ + 1;
    ppJStack_28 = ppJStack_28 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_decompress_ptr cinfo,
	      JSAMPIMAGE input_buf, JDIMENSION input_row,
	      JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION count;
  register int num_components = cinfo->num_components;
  JDIMENSION num_cols = cinfo->output_width;
  int ci;

  while (--num_rows >= 0) {
    for (ci = 0; ci < num_components; ci++) {
      inptr = input_buf[ci][input_row];
      outptr = output_buf[0] + ci;
      for (count = num_cols; count > 0; count--) {
	*outptr = *inptr++;	/* needn't bother with GETJSAMPLE() here */
	outptr += num_components;
      }
    }
    input_row++;
    output_buf++;
  }
}